

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poisson.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ostream *poVar10;
  void *__s;
  pointer pPVar11;
  pointer pbVar12;
  int *def_val;
  DefaultPRNG DVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar17;
  Point *p_1;
  Point *p;
  undefined1 auVar18 [16];
  uint uVar19;
  float fVar20;
  uint uVar21;
  Point center;
  Point center_00;
  DefaultPRNG PRNG;
  uint numPoints;
  vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> Points;
  ofstream File;
  char *local_308 [2];
  uint auStack_2f8 [122];
  parser cmdl;
  void *pvVar16;
  
  PrintBanner();
  argh::parser::parser(&cmdl,argv,1);
  pbVar12 = &cmdl.empty_;
  if (0x20 < (ulong)((long)cmdl.pos_args_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)cmdl.pos_args_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pbVar12 = cmdl.pos_args_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  if (pbVar12->_M_string_length != 0) {
    pbVar12 = &cmdl.empty_;
    if (0x20 < (ulong)((long)cmdl.pos_args_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)cmdl.pos_args_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pbVar12 = cmdl.pos_args_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    LoadDensityMap((pbVar12->_M_dataplus)._M_p);
  }
  _File = "--raw-points";
  bVar5 = std::
          any_of<char_const*const*,argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>
                    ((char **)&File,local_308,&cmdl);
  _File = "--square";
  bVar6 = std::
          any_of<char_const*const*,argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>
                    ((char **)&File,local_308,&cmdl);
  _File = "--vogel-disk";
  bVar7 = std::
          any_of<char_const*const*,argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>
                    ((char **)&File,local_308,&cmdl);
  _File = "--jittered-grid";
  bVar8 = std::
          any_of<char_const*const*,argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>
                    ((char **)&File,local_308,&cmdl);
  _File = "--hammersley";
  bVar9 = std::
          any_of<char_const*const*,argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>
                    ((char **)&File,local_308,&cmdl);
  std::__cxx11::string::string((string *)&Points,"num-points",(allocator *)&PRNG);
  piVar14 = &kNumPointsDefaultPoisson;
  if (bVar8) {
    piVar14 = &kNumPointsDefaultJittered;
  }
  def_val = &kNumPointsDefaultVogel;
  if (!bVar7) {
    def_val = piVar14;
  }
  argh::parser::operator()((string_stream *)&File,&cmdl,(string *)&Points,def_val);
  std::istream::_M_extract<unsigned_int>((uint *)&File);
  std::__cxx11::istringstream::~istringstream((istringstream *)&File);
  std::__cxx11::string::~string((string *)&Points);
  poVar10 = std::operator<<((ostream *)&std::cout,"NumPoints = ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::endl<char,std::char_traits<char>>(poVar10);
  PRNG.seed_ = 0x6cd7ef;
  if (bVar7) {
    center._8_4_ = SUB84(def_val,0);
    center.x = 0.5;
    center.y = 0.5;
    PoissonGenerator::generateVogelPoints(&Points,numPoints,true,0.0,center);
  }
  else if (bVar8) {
    center_00._8_4_ = 1;
    center_00.x = 0.5;
    center_00.y = 0.5;
    PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
              (&Points,numPoints,&PRNG,!bVar6,0.004,center_00);
  }
  else if (bVar9) {
    PoissonGenerator::generateHammersleyPoints(&Points,numPoints);
  }
  else {
    PoissonGenerator::generatePoissonPoints<PoissonGenerator::DefaultPRNG>
              (&Points,numPoints,&PRNG,!bVar6,0x1e,-1.0);
  }
  __s = operator_new__(0xc0000);
  pvVar16 = __s;
  memset(__s,0,0xc0000);
  pfVar4 = g_DensityMap;
  pPVar11 = Points.
            super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>.
            _M_impl.super__Vector_impl_data._M_start;
  DVar13 = PRNG;
  do {
    if (pPVar11 ==
        Points.super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      SaveBMP("Points.bmp",__s,0x200,0x200);
      operator_delete__(__s);
      std::ofstream::ofstream(&File,"points.txt",_S_out);
      if (bVar5) {
        poVar10 = std::operator<<((ostream *)&File,"NumPoints = ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::endl<char,std::char_traits<char>>(poVar10);
        for (; Points.
               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               Points.
               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            Points.
            super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 Points.
                 super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&File,
                               (Points.
                                super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                                ._M_impl.super__Vector_impl_data._M_start)->x);
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,(Points.
                                        super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->y);
          std::endl<char,std::char_traits<char>>(poVar10);
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&File,"const vec2 points[");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,"]");
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&File,"{");
        std::endl<char,std::char_traits<char>>(poVar10);
        *(uint *)((long)auStack_2f8 + *(long *)(_File + -0x18)) =
             *(uint *)((long)auStack_2f8 + *(long *)(_File + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)local_308 + *(long *)(_File + -0x18)) = 6;
        for (; Points.
               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               Points.
               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            Points.
            super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 Points.
                 super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          poVar10 = std::operator<<((ostream *)&File,"\tvec2(");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,(Points.
                                        super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->x);
          poVar10 = std::operator<<(poVar10,"f, ");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,(Points.
                                        super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->y);
          poVar10 = std::operator<<(poVar10,"f),");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        poVar10 = std::operator<<((ostream *)&File,"};");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      std::ofstream::~ofstream(&File);
      std::_Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::
      ~_Vector_base(&Points.
                     super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                   );
      argh::parser::~parser(&cmdl);
      return 0;
    }
    uVar2 = pPVar11->x;
    uVar3 = pPVar11->y;
    uVar19 = (uint)((float)uVar2 * 512.0);
    uVar21 = (uint)((float)uVar3 * 512.0);
    auVar18._0_4_ = -(uint)(-0x7ffffe01 < (int)(uVar19 ^ 0x80000000));
    auVar18._4_4_ = -(uint)(-0x7ffffe01 < (int)(uVar19 ^ 0x80000000));
    auVar18._8_4_ = -(uint)(-0x7ffffe01 < (int)(uVar21 ^ 0x80000000));
    auVar18._12_4_ = -(uint)(-0x7ffffe01 < (int)(uVar21 ^ 0x80000000));
    uVar15 = movmskpd((int)pvVar16,auVar18);
    pvVar16 = (void *)(ulong)uVar15;
    if (uVar15 == 0) {
      pvVar16 = (void *)(ulong)uVar19;
      if (pfVar4 == (float *)0x0) {
        uVar17 = (ulong)(uVar21 << 9 | uVar19);
      }
      else {
        DVar13.seed_ = DVar13.seed_ * 0x7f3cf;
        fVar20 = ((float)(DVar13.seed_ & 0x7fffff | 0x40000000) + -2.0) * 0.5;
        uVar17 = (ulong)(uVar21 << 9 | uVar19);
        pfVar1 = pfVar4 + uVar17;
        PRNG.seed_ = DVar13.seed_;
        if (*pfVar1 <= fVar20 && fVar20 != *pfVar1) goto LAB_00102dc9;
      }
      pvVar16 = (void *)(uVar17 * 3);
      *(undefined1 *)((long)__s + 2 + (long)pvVar16) = 0xff;
      *(undefined2 *)((long)__s + (long)pvVar16) = 0xffff;
    }
LAB_00102dc9:
    pPVar11 = pPVar11 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  PrintBanner();

  argh::parser cmdl(argv);

  if (!cmdl[1].empty()) {
    LoadDensityMap(cmdl[1].c_str());
  }

  const bool cmdRawPointsOutput = cmdl[{"--raw-points"}];
  const bool cmdSquare = cmdl[{"--square"}];
  const bool cmdVogelDisk = cmdl[{"--vogel-disk"}];
  const bool cmdJitteredGrid = cmdl[{"--jittered-grid"}];
  ;
  const bool cmdHammersley = cmdl[{"--hammersley"}];
  ;

  unsigned int numPoints;
  cmdl("num-points", cmdVogelDisk ? kNumPointsDefaultVogel : (cmdJitteredGrid ? kNumPointsDefaultJittered : kNumPointsDefaultPoisson)) >>
      numPoints;

  std::cout << "NumPoints = " << numPoints << std::endl;

  PoissonGenerator::DefaultPRNG PRNG;

  const auto Points = cmdVogelDisk      ? PoissonGenerator::generateVogelPoints(numPoints)
                      : cmdJitteredGrid ? PoissonGenerator::generateJitteredGridPoints(numPoints, PRNG, !cmdSquare)
                      : cmdHammersley   ? PoissonGenerator::generateHammersleyPoints(numPoints)
                                        : PoissonGenerator::generatePoissonPoints(numPoints, PRNG, !cmdSquare);

  // prepare BGR image
  const size_t DataSize = 3 * kImageSize * kImageSize;

  unsigned char* Img = new unsigned char[DataSize];

  memset(Img, 0, DataSize);

  for (auto i = Points.begin(); i != Points.end(); i++) {
    int x = int(i->x * kImageSize);
    int y = int(i->y * kImageSize);
    if (x < 0 || y < 0 || x >= kImageSize || y >= kImageSize)
      continue;
    if (g_DensityMap) {
      // dice
      float R = PRNG.randomFloat();
      float P = g_DensityMap[x + y * kImageSize];
      if (R > P)
        continue;
    }
    int Base = 3 * (x + y * kImageSize);
    Img[Base + 0] = Img[Base + 1] = Img[Base + 2] = 255;
  }

  SaveBMP("Points.bmp", Img, kImageSize, kImageSize);

  delete[] (Img);

  // dump points to a text file
  std::ofstream File("points.txt", std::ios::out);

  if (cmdRawPointsOutput) {
    File << "NumPoints = " << Points.size() << std::endl;

    for (const auto& p : Points) {
      File << p.x << " " << p.y << std::endl;
    }
  } else {
    File << "const vec2 points[" << Points.size() << "]" << std::endl;
    File << "{" << std::endl;
    File << std::fixed << std::setprecision(6);
    for (const auto& p : Points) {
      File << "\tvec2(" << p.x << "f, " << p.y << "f)," << std::endl;
    }
    File << "};" << std::endl;
  }

  return 0;
}